

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRoundItem.h
# Opt level: O1

void __thiscall TimeRoundItem<channel>::~TimeRoundItem(TimeRoundItem<channel> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Manager_type p_Var1;
  
  if (((this->ptr).super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) && ((this->fun).super__Function_base._M_manager != (_Manager_type)0x0))
  {
    (*(this->fun)._M_invoker)((_Any_data *)&this->fun);
  }
  this_00 = (this->ptr).super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  p_Var1 = (this->fun).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->fun,(_Any_data *)&this->fun,__destroy_functor);
  }
  return;
}

Assistant:

~TimeRoundItem()
        {
            if(ptr && fun)
            {
                fun();
            }
        }